

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mutex.h
# Opt level: O0

void __thiscall FIX::Mutex::lock(Mutex *this)

{
  pthread_t pVar1;
  pthread_t pVar2;
  Mutex *this_local;
  
  if ((*(int *)(this + 0x30) != 0) &&
     (pVar2 = *(pthread_t *)(this + 0x28), pVar1 = pthread_self(), pVar2 == pVar1)) {
    *(int *)(this + 0x30) = *(int *)(this + 0x30) + 1;
    return;
  }
  pthread_mutex_lock((pthread_mutex_t *)this);
  *(int *)(this + 0x30) = *(int *)(this + 0x30) + 1;
  pVar2 = pthread_self();
  *(pthread_t *)(this + 0x28) = pVar2;
  return;
}

Assistant:

void lock() {
#ifdef _MSC_VER
    EnterCriticalSection(&m_mutex);
#else
    if (m_count && m_threadID == pthread_self()) {
      ++m_count;
      return;
    }
    pthread_mutex_lock(&m_mutex);
    ++m_count;
    m_threadID = pthread_self();
#endif
  }